

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack21_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *in;
  *out = uVar1 & 0x1fffff;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x15;
  out[1] = uVar1 >> 0x15 | (uVar2 & 0x3ff) << 0xb;
  uVar1 = in[2];
  out[2] = uVar2 >> 10 & 0x1fffff;
  out[3] = uVar2 >> 0x1f;
  out[3] = uVar2 >> 0x1f | (uVar1 & 0xfffff) << 1;
  uVar2 = in[3];
  out[4] = uVar1 >> 0x14;
  out[4] = uVar1 >> 0x14 | (uVar2 & 0x1ff) << 0xc;
  out[5] = uVar2 >> 9 & 0x1fffff;
  uVar1 = in[4];
  out[6] = uVar2 >> 0x1e;
  out[6] = uVar2 >> 0x1e | (uVar1 & 0x7ffff) << 2;
  out[7] = uVar1 >> 0x13;
  uVar2 = in[5];
  out[7] = uVar1 >> 0x13 | (uVar2 & 0xff) << 0xd;
  out[8] = uVar2 >> 8 & 0x1fffff;
  uVar1 = in[6];
  out[9] = uVar2 >> 0x1d;
  out[9] = uVar2 >> 0x1d | (uVar1 & 0x3ffff) << 3;
  out[10] = uVar1 >> 0x12;
  uVar2 = in[7];
  out[10] = uVar1 >> 0x12 | (uVar2 & 0x7f) << 0xe;
  out[0xb] = uVar2 >> 7 & 0x1fffff;
  out[0xc] = uVar2 >> 0x1c;
  uVar1 = in[8];
  out[0xc] = uVar2 >> 0x1c | (uVar1 & 0x1ffff) << 4;
  out[0xd] = uVar1 >> 0x11;
  uVar2 = in[9];
  out[0xd] = uVar1 >> 0x11 | (uVar2 & 0x3f) << 0xf;
  out[0xe] = uVar2 >> 6 & 0x1fffff;
  out[0xf] = uVar2 >> 0x1b;
  uVar1 = in[10];
  uVar3 = in[0xb];
  out[0xf] = uVar2 >> 0x1b | (uVar1 & 0xffff) << 5;
  out[0x10] = uVar1 >> 0x10;
  out[0x10] = uVar1 >> 0x10 | (uVar3 & 0x1f) << 0x10;
  out[0x11] = uVar3 >> 5 & 0x1fffff;
  out[0x12] = uVar3 >> 0x1a;
  uVar1 = in[0xc];
  out[0x12] = uVar3 >> 0x1a | (uVar1 & 0x7fff) << 6;
  uVar2 = in[0xd];
  out[0x13] = uVar1 >> 0xf;
  out[0x13] = uVar1 >> 0xf | (uVar2 & 0xf) << 0x11;
  uVar1 = in[0xe];
  out[0x14] = uVar2 >> 4 & 0x1fffff;
  out[0x15] = uVar2 >> 0x19;
  out[0x15] = uVar2 >> 0x19 | (uVar1 & 0x3fff) << 7;
  uVar2 = in[0xf];
  out[0x16] = uVar1 >> 0xe;
  out[0x16] = uVar1 >> 0xe | (uVar2 & 7) << 0x12;
  out[0x17] = uVar2 >> 3 & 0x1fffff;
  uVar1 = in[0x10];
  out[0x18] = uVar2 >> 0x18;
  out[0x18] = uVar2 >> 0x18 | (uVar1 & 0x1fff) << 8;
  out[0x19] = uVar1 >> 0xd;
  uVar2 = in[0x11];
  out[0x19] = uVar1 >> 0xd | (uVar2 & 3) << 0x13;
  out[0x1a] = uVar2 >> 2 & 0x1fffff;
  uVar1 = in[0x12];
  out[0x1b] = uVar2 >> 0x17;
  out[0x1b] = uVar2 >> 0x17 | (uVar1 & 0xfff) << 9;
  out[0x1c] = uVar1 >> 0xc;
  uVar2 = in[0x13];
  out[0x1c] = uVar1 >> 0xc | (uVar2 & 1) << 0x14;
  out[0x1d] = uVar2 >> 1 & 0x1fffff;
  out[0x1e] = uVar2 >> 0x16;
  uVar1 = in[0x14];
  out[0x1e] = uVar2 >> 0x16 | (uVar1 & 0x7ff) << 10;
  out[0x1f] = uVar1 >> 0xb;
  return in + 0x15;
}

Assistant:

const uint32_t *__fastunpack21_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 10)) << (21 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 21);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 20)) << (21 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 9)) << (21 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 21);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 19)) << (21 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 8)) << (21 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 21);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 18)) << (21 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 7)) << (21 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 21);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 17)) << (21 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 6)) << (21 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 21);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 16)) << (21 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 5)) << (21 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 21);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 15)) << (21 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 4)) << (21 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 21);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 14)) << (21 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 3)) << (21 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 21);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 13)) << (21 - 13);
  out++;
  *out = ((*in) >> 13);
  ++in;
  *out |= ((*in) % (1U << 2)) << (21 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 21);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 12)) << (21 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 1)) << (21 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 21);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 11)) << (21 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  out++;

  return in;
}